

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac.c
# Opt level: O3

void InitMacCtx(arguments *args,MacCtx_t *context,uint64_t *mac_key)

{
  SkeinSize_t size;
  uint uVar1;
  
  size = args->state_size;
  uVar1 = size >> 3;
  context->skein_context_ptr = &context->skein_context;
  context->out_action = (~args->field_0x3c & 1) << 2 | 3;
  context->mac_key = mac_key;
  context->digest_byte_size = (ulong)uVar1;
  skeinCtxPrepare(&context->skein_context,size);
  skeinMacInit(context->skein_context_ptr,(uint8_t *)mac_key,(ulong)(uVar1 & 0x1fff),
               (ulong)args->state_size);
  return;
}

Assistant:

void InitMacCtx(const arguments* args,
                MacCtx_t* context,
                uint64_t* mac_key)
{
    const uint16_t key_byte_size = (const uint16_t)args->state_size/8;

    context->skein_context_ptr = &(context->skein_context);
    context->out_action = args->encrypt ? DECRYPT : WRITE;
    context->mac_key = mac_key;
    context->digest_byte_size = (uint64_t)args->state_size/8;

    skeinCtxPrepare(context->skein_context_ptr, args->state_size);
    skeinMacInit(context->skein_context_ptr, 
                 (uint8_t*)mac_key, 
                 key_byte_size, 
                 args->state_size); //digest size is in bits in Skein Mac Init
}